

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void play_sysex(uint8_t *msg,uint len)

{
  uint len_00;
  Player *pPVar1;
  
  if ((((3 < len) && (*msg == 0xf0)) && (msg[len - 1] == 0xf7)) &&
     ((msg[2] == '\x7f' || (msg[2] == '\x10')))) {
    pPVar1 = active_player();
    if (msg[1] == 'A') {
      if (((9 < len) && (msg[4] == '\x12')) &&
         ((msg[3] == 'E' && (((uint)msg[7] | (uint)msg[6] << 8 | (uint)msg[5] << 0x10) == 0x100000))
         )) {
        len_00 = len - 10;
        if (0xff < len - 10) {
          len_00 = 0x100;
        }
        notify(Notify_TextInsert,msg + 8,len_00);
        return;
      }
    }
    else if (msg[1] == '\x7f') {
      (*pPVar1->_vptr_Player[0x1b])(pPVar1,msg,(ulong)len,pPVar1->_vptr_Player[0x1b]);
      return;
    }
  }
  return;
}

Assistant:

void play_sysex(const uint8_t *msg, unsigned len)
{
    if (len < 4 || msg[0] != 0xf0 || msg[len - 1] != 0xf7 ||
        (msg[2] != sysex_device_id && msg[2] != sysex_broadcast_id))
        return;

    Player &player = active_player();
    uint8_t manufacturer = msg[1];
    switch (manufacturer) {
        case 0x7f: // Universal realtime
            player.rt_system_exclusive(msg, len);
            break;
        case 0x41:  // Roland
            if (len < 10)
                break;
            else {
                uint8_t model = msg[3];
                uint8_t mode = msg[4];
                unsigned address = (msg[5] << 16) | (msg[6] << 8) | msg[7];
                // uint8_t checksum = msg[len - 2];
                if (mode == 0x12) {  // receive
                    const uint8_t *data = &msg[8];
                    unsigned datalen = len - 10;
                    switch (model) {
                    case 0x42:
                        play_roland_sysex(address, data, datalen); break;
                    case 0x45:
                        play_roland_sc_sysex(address, data, datalen); break;
                    }
                }
            }
            break;
    }
}